

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_takeUnits_Test::TestBody(Units_takeUnits_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_2e8 [8];
  Message local_2e0 [15];
  allocator<char> local_2d1;
  string local_2d0 [32];
  shared_ptr<libcellml::Units> local_2b0;
  undefined1 local_2a0 [16];
  AssertionResult gtest_ar_5;
  Message local_280 [8];
  shared_ptr<libcellml::Units> local_278;
  undefined1 local_268 [16];
  AssertionResult gtest_ar_4;
  Message local_248 [8];
  unsigned_long local_240 [2];
  undefined1 local_230 [8];
  AssertionResult gtest_ar_3;
  Message local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  UnitsPtr u5;
  Message local_1c8 [8];
  unsigned_long local_1c0 [2];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  Message local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  string local_158 [32];
  undefined1 local_138 [8];
  UnitsPtr u4;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  UnitsPtr u3;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr m;
  Units_takeUnits_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"a_unit",&local_71);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"b_unit",&local_a9);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"c_unit",&local_d1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"micro",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"",
             (allocator<char> *)
             ((long)&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,(string *)0x0,1.0,1.0,local_f8);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"b_unit",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Model::takeUnits((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_138);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_170,"\"b_unit\"","u4->name()",(char (*) [7])"b_unit",
             &local_190);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x128,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1c0[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1c0[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1b0,"size_t(2)","m->unitsCount()",local_1c0 + 1,local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x129,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_1c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Model::takeUnits((ulong)&gtest_ar_2.message_);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_2.message_);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1f0,"\"c_unit\"","u5->name()",(char (*) [7])"c_unit",
             &local_210);
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,300,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_240[1] = 1;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_240[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_230,"size_t(1)","m->unitsCount()",local_240 + 1,local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x12d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_268._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Model::takeUnits((ulong)&local_278);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_268 + 8,"nullptr",(void **)"m->takeUnits(7)",
             (shared_ptr<libcellml::Units> *)local_268,&local_278);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_268 + 8));
  if (!bVar1) {
    testing::Message::Message(local_280);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_268 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x12f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_268 + 8));
  local_2a0._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"d_unit",&local_2d1);
  libcellml::Model::takeUnits((string *)&local_2b0);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_2a0 + 8,"nullptr",(void **)"m->takeUnits(\"d_unit\")",
             (shared_ptr<libcellml::Units> *)local_2a0,&local_2b0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2a0 + 8));
  if (!bVar1) {
    testing::Message::Message(local_2e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_2a0 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x131,pcVar4);
    testing::internal::AssertHelper::operator=(local_2e8,local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2e8);
    testing::Message::~Message(local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_2a0 + 8));
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_138);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_50);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, takeUnits)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::UnitsPtr u3 = libcellml::Units::create();

    u1->setName("a_unit");
    u2->setName("b_unit");
    u3->setName("c_unit");

    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    m->addUnits(u1);
    m->addUnits(u2);
    m->addUnits(u3);

    libcellml::UnitsPtr u4 = m->takeUnits("b_unit");
    EXPECT_EQ("b_unit", u4->name());
    EXPECT_EQ(size_t(2), m->unitsCount());

    libcellml::UnitsPtr u5 = m->takeUnits(1);
    EXPECT_EQ("c_unit", u5->name());
    EXPECT_EQ(size_t(1), m->unitsCount());

    EXPECT_EQ(nullptr, m->takeUnits(7));

    EXPECT_EQ(nullptr, m->takeUnits("d_unit"));
}